

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializer.cpp
# Opt level: O0

void __thiscall
Am_Initializer::Am_Initializer
          (Am_Initializer *this,char *this_name,Am_Initializer_Procedure *init_proc,
          float this_priority,uint aCheckPoint,Am_Initializer_Procedure *cleanup_proc)

{
  INITIALIZERLIST *this_00;
  bool bVar1;
  list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_> *this_01;
  reference ppAVar2;
  Am_Initializer *local_70;
  _List_node_base *local_68;
  Am_Initializer *local_60;
  const_iterator local_58;
  _Self local_50;
  _Self local_48;
  iterator it;
  Am_Initializer *pAStack_38;
  bool inserted;
  Am_Initializer_Procedure *local_30;
  Am_Initializer_Procedure *cleanup_proc_local;
  uint aCheckPoint_local;
  float this_priority_local;
  Am_Initializer_Procedure *init_proc_local;
  char *this_name_local;
  Am_Initializer *this_local;
  
  this->name = this_name;
  this->priority = this_priority;
  this->mCheckPoint = aCheckPoint;
  this->init = init_proc;
  this->cleanup = cleanup_proc;
  local_30 = cleanup_proc;
  cleanup_proc_local._0_4_ = aCheckPoint;
  cleanup_proc_local._4_4_ = this_priority;
  _aCheckPoint_local = init_proc;
  init_proc_local = (Am_Initializer_Procedure *)this_name;
  this_name_local = (char *)this;
  if (am_initializer_list_abi_cxx11_ == (INITIALIZERLIST *)0x0) {
    this_01 = (list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_> *)operator_new(0x18);
    memset(this_01,0,0x18);
    std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::list(this_01);
    am_initializer_list_abi_cxx11_ = this_01;
    pAStack_38 = this;
    std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::push_front
              (this_01,&stack0xffffffffffffffc8);
  }
  else {
    it._M_node._7_1_ = 0;
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::begin
                   (am_initializer_list_abi_cxx11_);
    while( true ) {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::end
                     (am_initializer_list_abi_cxx11_);
      bVar1 = std::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      ppAVar2 = std::_List_iterator<Am_Initializer_*>::operator*(&local_48);
      this_00 = am_initializer_list_abi_cxx11_;
      if (cleanup_proc_local._4_4_ <= (*ppAVar2)->priority) {
        std::_List_const_iterator<Am_Initializer_*>::_List_const_iterator(&local_58,&local_48);
        local_60 = this;
        local_68 = (_List_node_base *)
                   std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::insert
                             (this_00,local_58,&local_60);
        it._M_node._7_1_ = 1;
        break;
      }
      std::_List_iterator<Am_Initializer_*>::operator++(&local_48);
    }
    if ((it._M_node._7_1_ & 1) == 0) {
      local_70 = this;
      std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::push_back
                (am_initializer_list_abi_cxx11_,&local_70);
    }
  }
  return;
}

Assistant:

Am_Initializer::Am_Initializer(const char *this_name,
                               Am_Initializer_Procedure *init_proc,
                               float this_priority, unsigned aCheckPoint,
                               Am_Initializer_Procedure *cleanup_proc)
    : cleanup(cleanup_proc), init(init_proc), name(this_name),
      priority(this_priority), mCheckPoint(aCheckPoint)
{
  // if this list is empty, we just add the element
  if (am_initializer_list == static_cast<INITIALIZERLIST *>(nullptr)) {
    am_initializer_list = new INITIALIZERLIST();
    am_initializer_list->push_front(this);
  } else {
    bool inserted(false);

    for (INITIALIZERLIST::iterator it = am_initializer_list->begin();
         it != am_initializer_list->end(); ++it) {
      // check to see if we have reached the point
      // where the object is inserted before
      if ((*it)->priority >= this_priority) {
        // insert the object and flag this
        am_initializer_list->insert(it, this);
        inserted = true;

        // exit the loop
        break;
      }
    }

    if (inserted == false) {
      // add to the end of the list
      am_initializer_list->push_back(this);
    }
  }
}